

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

int run_test_we_get_signal_one_shot(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  int iVar4;
  timer_ctx tc;
  signal_ctx sc;
  timer_ctx tStack_4f0;
  undefined1 auStack_448 [168];
  undefined1 auStack_3a0 [168];
  undefined1 auStack_2f8 [168];
  signal_ctx sStack_250;
  uv_loop_t *puStack_1a0;
  timer_ctx local_160;
  signal_ctx local_b8;
  
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,&local_160);
  start_watcher(puVar2,0x11,&local_b8,1);
  local_b8.stop_or_close = NOOP;
  iVar4 = 0;
  puVar3 = puVar2;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    if (local_160.ncalls != 10) goto LAB_00169271;
    if (local_b8.ncalls != 1) goto LAB_00169276;
    start_timer(puVar2,0x11,&local_160);
    iVar4 = 0;
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016927b;
    if (local_b8.ncalls != 1) goto LAB_00169280;
    local_b8.stop_or_close = CLOSE;
    local_b8.ncalls = 0;
    uv_signal_start_oneshot(&local_b8.handle,signal_cb_one_shot,0x11);
    start_timer(puVar2,0x11,&local_160);
    iVar4 = 0;
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169285;
    if (local_160.ncalls != 10) goto LAB_0016928a;
    if (local_b8.ncalls != 1) goto LAB_0016928f;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_00169271:
    run_test_we_get_signal_one_shot_cold_2();
LAB_00169276:
    run_test_we_get_signal_one_shot_cold_3();
LAB_0016927b:
    run_test_we_get_signal_one_shot_cold_4();
LAB_00169280:
    run_test_we_get_signal_one_shot_cold_5();
LAB_00169285:
    run_test_we_get_signal_one_shot_cold_6();
LAB_0016928a:
    run_test_we_get_signal_one_shot_cold_7();
LAB_0016928f:
    run_test_we_get_signal_one_shot_cold_8();
  }
  run_test_we_get_signal_one_shot_cold_9();
  if ((puVar3->wq_mutex).__data.__kind == iVar4) {
    iVar1 = *(int *)&puVar3[-1].field_0x34c;
    *(int *)&puVar3[-1].field_0x34c = iVar1 + 1;
    if (iVar1 == 0) {
      if (puVar3[-1].inotify_fd != 0) {
        return extraout_EAX;
      }
      uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_1a0 = puVar2;
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,&tStack_4f0);
  start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,1);
  start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,1);
  auStack_448._0_4_ = CLOSE;
  auStack_3a0._0_4_ = CLOSE;
  puVar3 = puVar2;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    if (tStack_4f0.ncalls != 10) goto LAB_001696f6;
    if (auStack_448._4_4_ != 1) goto LAB_001696fb;
    if (auStack_3a0._4_4_ != 1) goto LAB_00169700;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,1);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,1);
    auStack_448._0_4_ = CLOSE;
    auStack_3a0._0_4_ = CLOSE;
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,0);
    uv_close((uv_handle_t *)(auStack_2f8 + 8),(uv_close_cb)0x0);
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169705;
    if (tStack_4f0.ncalls != 10) goto LAB_0016970a;
    if (auStack_448._4_4_ != 1) goto LAB_0016970f;
    if (auStack_3a0._4_4_ != 1) goto LAB_00169714;
    if (auStack_2f8._4_4_ != 0) goto LAB_00169719;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,0);
    auStack_448._0_4_ = CLOSE;
    auStack_3a0._0_4_ = CLOSE;
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,1);
    uv_close((uv_handle_t *)(auStack_2f8 + 8),(uv_close_cb)0x0);
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016971e;
    if (tStack_4f0.ncalls != 10) goto LAB_00169723;
    if (auStack_448._4_4_ != 10) goto LAB_00169728;
    if (auStack_3a0._4_4_ != 10) goto LAB_0016972d;
    if (auStack_2f8._4_4_ != 0) goto LAB_00169732;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,1);
    start_watcher(puVar2,0x11,&sStack_250,1);
    auStack_2f8._0_4_ = CLOSE;
    sStack_250.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_448 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_3a0 + 8),(uv_close_cb)0x0);
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169737;
    if (tStack_4f0.ncalls != 10) goto LAB_0016973c;
    if (auStack_448._4_4_ != 0) goto LAB_00169741;
    if (auStack_3a0._4_4_ != 0) goto LAB_00169746;
    if (auStack_2f8._4_4_ != 1) goto LAB_0016974b;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,1);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,0);
    start_watcher(puVar2,0x11,&sStack_250,0);
    sStack_250.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_448 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_2f8 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169750;
    if (tStack_4f0.ncalls != 10) goto LAB_00169755;
    if (auStack_448._4_4_ != 0) goto LAB_0016975a;
    if (auStack_3a0._4_4_ != 1) goto LAB_0016975f;
    if (auStack_2f8._4_4_ != 0) goto LAB_00169764;
    if (sStack_250.ncalls == 10) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016976e;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001696f6:
    run_test_we_get_signals_mixed_cold_2();
LAB_001696fb:
    run_test_we_get_signals_mixed_cold_3();
LAB_00169700:
    run_test_we_get_signals_mixed_cold_4();
LAB_00169705:
    run_test_we_get_signals_mixed_cold_5();
LAB_0016970a:
    run_test_we_get_signals_mixed_cold_6();
LAB_0016970f:
    run_test_we_get_signals_mixed_cold_7();
LAB_00169714:
    run_test_we_get_signals_mixed_cold_8();
LAB_00169719:
    run_test_we_get_signals_mixed_cold_9();
LAB_0016971e:
    run_test_we_get_signals_mixed_cold_10();
LAB_00169723:
    run_test_we_get_signals_mixed_cold_11();
LAB_00169728:
    run_test_we_get_signals_mixed_cold_12();
LAB_0016972d:
    run_test_we_get_signals_mixed_cold_13();
LAB_00169732:
    run_test_we_get_signals_mixed_cold_14();
LAB_00169737:
    run_test_we_get_signals_mixed_cold_15();
LAB_0016973c:
    run_test_we_get_signals_mixed_cold_16();
LAB_00169741:
    run_test_we_get_signals_mixed_cold_17();
LAB_00169746:
    run_test_we_get_signals_mixed_cold_18();
LAB_0016974b:
    puVar2 = puVar3;
    run_test_we_get_signals_mixed_cold_19();
LAB_00169750:
    run_test_we_get_signals_mixed_cold_20();
LAB_00169755:
    run_test_we_get_signals_mixed_cold_21();
LAB_0016975a:
    run_test_we_get_signals_mixed_cold_22();
LAB_0016975f:
    run_test_we_get_signals_mixed_cold_23();
LAB_00169764:
    run_test_we_get_signals_mixed_cold_24();
  }
  run_test_we_get_signals_mixed_cold_25();
LAB_0016976e:
  run_test_we_get_signals_mixed_cold_26();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(we_get_signal_one_shot) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 1);
  sc.stop_or_close = NOOP;
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(sc.ncalls == 1);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start_oneshot(&sc.handle, signal_cb_one_shot, SIGCHLD);
  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}